

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemWatcher_inotify.cpp
# Opt level: O2

int __thiscall FileSystemWatcher::init(FileSystemWatcher *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  EventLoop *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  function<void_(int,_unsigned_int)> local_50;
  _Bind<void_(FileSystemWatcher::*(FileSystemWatcher_*))()> local_30;
  
  iVar1 = inotify_init1(0x80000);
  this->mFd = iVar1;
  if (iVar1 != -1) {
    EventLoop::eventLoop();
    iVar1 = this->mFd;
    local_30._M_f = (offset_in_FileSystemWatcher_to_subr)notifyReadyRead;
    local_30._8_8_ = 0;
    local_30._M_bound_args.super__Tuple_impl<0UL,_FileSystemWatcher_*>.
    super__Head_base<0UL,_FileSystemWatcher_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_FileSystemWatcher_*>)(_Tuple_impl<0UL,_FileSystemWatcher_*>)this;
    std::function<void(int,unsigned_int)>::
    function<std::_Bind<void(FileSystemWatcher::*(FileSystemWatcher*))()>,void>
              ((function<void(int,unsigned_int)> *)&local_50,&local_30);
    EventLoop::registerSocket(local_60,iVar1,1,&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
    return extraout_EAX;
  }
  __assert_fail("mFd != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/FileSystemWatcher_inotify.cpp"
                ,0x11,"void FileSystemWatcher::init()");
}

Assistant:

void FileSystemWatcher::init()
{
    mFd = inotify_init1(IN_CLOEXEC);
    assert(mFd != -1);
    EventLoop::eventLoop()->registerSocket(mFd, EventLoop::SocketRead, std::bind(&FileSystemWatcher::notifyReadyRead, this));
}